

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *ws)

{
  long in_RDI;
  
  if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x10)) {
    __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x42d5,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
  }
  if (*(ulong *)(in_RDI + 0x20) <= *(ulong *)(in_RDI + 0x28)) {
    if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x18)) {
      *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x18);
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    return;
  }
  __assert_fail("ws->tableValidEnd <= ws->allocStart",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x42d6,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
}

Assistant:

MEM_STATIC void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp* ws) {
    DEBUGLOG(4, "cwksp: ZSTD_cwksp_mark_tables_clean");
    assert(ws->tableValidEnd >= ws->objectEnd);
    assert(ws->tableValidEnd <= ws->allocStart);
    if (ws->tableValidEnd < ws->tableEnd) {
        ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
}